

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  undefined8 *in_RSI;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_RDI;
  undefined8 in_stack_ffffffffffffffe8;
  
  bVar1 = internal::
          format_uint<3u,char,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_int>
                    (in_RDI,(uint)((ulong)in_RSI >> 0x20),(int)in_RSI,
                     SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0));
  *in_RSI = bVar1.container;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }